

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

vm_obj_id_t __thiscall CTcGenTarg::gen_rexpat_obj(CTcGenTarg *this,char *txt,size_t len)

{
  tctarg_obj_id_t tVar1;
  CTcDataStream *this_00;
  char *in_RDX;
  CTcGenTarg *in_RSI;
  CTcGenTarg *in_RDI;
  char buf [5];
  vm_val_t val;
  vm_obj_id_t id;
  CTcDataStream *rs;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa8;
  tctarg_obj_id_t id_00;
  CTcParser *in_stack_ffffffffffffffb0;
  undefined1 local_3d [13];
  ulong in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  CTcDataStream *this_01;
  
  id_00 = (tctarg_obj_id_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  this_00 = G_rexpat_stream;
  tVar1 = new_obj_id(in_RDI);
  CTcParser::add_nonsym_obj(in_stack_ffffffffffffffb0,id_00);
  CTcDataStream::write_obj_id
            ((CTcDataStream *)in_RDI,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  CTcDataStream::write2((CTcDataStream *)in_RDI,in_stack_ffffffffffffff9c);
  this_01 = this_00;
  CTcDataStream::get_ofs(this_00);
  add_const_str(in_RSI,in_RDX,(size_t)this_01,
                (CTcDataStream *)CONCAT44(tVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0
               );
  vm_val_t::set_sstring((vm_val_t *)(local_3d + 5),0);
  vmb_put_dh((char *)in_RDI,
             (vm_val_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  CTcDataStream::write(this_01,(int)local_3d,(void *)0x5,(size_t)this_00);
  return tVar1;
}

Assistant:

vm_obj_id_t CTcGenTarg::gen_rexpat_obj(const char *txt, size_t len)
{
    /* write to RexPattern object stream */
    CTcDataStream *rs = G_rexpat_stream;

    /* generate a new object ID for the RexPattern object */
    vm_obj_id_t id = new_obj_id();

    /* add the object ID to the non-symbol object list */
    G_prs->add_nonsym_obj(id);

    /* 
     *   write the OBJS header - object ID plus byte count for metaclass data
     *   (a DATAHOLDER pointing to the constant string)
     */
    rs->write_obj_id(id);
    rs->write2(VMB_DATAHOLDER);

    /* 
     *   Add the source text as an ordinary constant string.  Generate its
     *   fixup in the RexPattern stream, in the DATAHOLDER we're about to
     *   write. 
     */
    add_const_str(txt, len, rs, rs->get_ofs() + 1);

    /* 
     *   Set up the constant string value.  Use zero as the pool offset,
     *   since the fixup for the constant string will fill this in when the
     *   pool layout is finalized. 
     */
    vm_val_t val;
    val.set_sstring(0);

    /* write the RexPattern data (a DATAHOLDER for the const string) */
    char buf[VMB_DATAHOLDER];
    vmb_put_dh(buf, &val);
    rs->write(buf, VMB_DATAHOLDER);

    /* return the new object ID */
    return id;
}